

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOcontroller.h
# Opt level: O1

void IOcontroller::
     save_file<std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>>
               (string *filename,
               vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               *output)

{
  ostream *poVar1;
  StreamType res;
  ofstream outfile;
  char local_239;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  long local_218;
  filebuf local_210 [24];
  byte abStack_1f8 [216];
  ios_base local_120 [264];
  
  std::ofstream::ofstream(&local_218,(string *)filename,_S_bin);
  if ((abStack_1f8[*(long *)(local_218 + -0x18)] & 7) == 0) {
    local_238._M_dataplus._M_p = (pointer)0x0;
    local_238._M_string_length = 0;
    local_238.field_2._M_allocated_capacity = 0;
    serialize<std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>>
              (output,(StreamType *)&local_238);
    std::ostream::write((char *)&local_218,(long)local_238._M_dataplus._M_p);
    std::ofstream::close();
    if ((pointer)local_238._M_string_length != local_238._M_dataplus._M_p) {
      local_238._M_string_length = (size_type)local_238._M_dataplus._M_p;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Save file successfully: ",0x18);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(filename->_M_dataplus)._M_p,
                        filename->_M_string_length);
    local_239 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_239,1);
    if (local_238._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_238._M_dataplus._M_p,
                      local_238.field_2._M_allocated_capacity - (long)local_238._M_dataplus._M_p);
    }
    local_218 = _VTT;
    *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
    std::filebuf::~filebuf(local_210);
    std::ios_base::~ios_base(local_120);
    return;
  }
  std::operator+(&local_238,"Save file failed: ",filename);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_238._M_dataplus._M_p,local_238._M_string_length);
  std::operator<<(poVar1,'\n');
  std::__cxx11::string::~string((string *)&local_238);
  exit(1);
}

Assistant:

static void save_file(const std::string filename, const T& output)
    {
        std::ofstream outfile(filename, std::ios::binary);
        if (!outfile.eof() && !outfile.fail())
        {
            StreamType res;
            serialize(output, res);
            outfile.write(reinterpret_cast<char*>(&res[0]), res.size());
            outfile.close();
            res.clear();
            std::cout << "Save file successfully: " << filename << '\n';
        }
        else
        {
            std::cout << "Save file failed: " + filename << '\n';
            exit(1);
        }
    }